

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,uint flag)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  InstOp IVar5;
  EmptyOp EVar6;
  ulong uVar7;
  int *inst_00;
  iterator piVar8;
  Inst *this_00;
  Inst *this_01;
  State *pSVar9;
  bool bVar10;
  State *state;
  int *markp;
  int *ep;
  int *ip_1;
  Inst *ip;
  iterator piStack_48;
  int id;
  iterator it;
  EmptyOp local_38;
  bool sawmark;
  int iStack_34;
  bool sawmatch;
  uint needflags;
  int n;
  int *inst;
  uint flag_local;
  Workq *q_local;
  DFA *this_local;
  
  Mutex::AssertHeld(&this->mutex_);
  iVar4 = Workq::size(q);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar4;
  uVar7 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  inst_00 = (int *)operator_new__(uVar7);
  iStack_34 = 0;
  local_38 = 0;
  bVar10 = false;
  bVar2 = false;
  piStack_48 = SparseSet::begin(&q->super_SparseSet);
  do {
    piVar8 = SparseSet::end(&q->super_SparseSet);
    if ((piStack_48 == piVar8) ||
       ((iVar4 = *piStack_48, bVar10 &&
        ((this->kind_ == kFirstMatch || (bVar3 = Workq::is_mark(q,iVar4), bVar3)))))) {
      iVar4 = Workq::size(q);
      if (iStack_34 <= iVar4) {
        if ((0 < iStack_34) && (inst_00[iStack_34 + -1] == -1)) {
          iStack_34 = iStack_34 + -1;
        }
        inst._4_4_ = flag;
        if (local_38 == 0) {
          inst._4_4_ = flag & 0x1000;
        }
        if ((iStack_34 == 0) && (inst._4_4_ == 0)) {
          if (inst_00 != (int *)0x0) {
            operator_delete__(inst_00);
          }
          this_local = (DFA *)0x1;
        }
        else {
          if (this->kind_ == kLongestMatch) {
            pSVar9 = (State *)(inst_00 + iStack_34);
            ep = inst_00;
            while (ep < pSVar9) {
              state = (State *)ep;
              while( true ) {
                bVar10 = false;
                if (state < pSVar9) {
                  bVar10 = *(int *)&state->inst_ != -1;
                }
                if (!bVar10) break;
                state = (State *)((long)&state->inst_ + 4);
              }
              std::sort<int*>(ep,(int *)state);
              if (state < pSVar9) {
                state = (State *)((long)&state->inst_ + 4);
              }
              ep = (int *)state;
            }
          }
          this_local = (DFA *)CachedState(this,inst_00,iStack_34,local_38 << 0x10 | inst._4_4_);
          if (inst_00 != (int *)0x0) {
            operator_delete__(inst_00);
          }
        }
        return (State *)this_local;
      }
      __assert_fail("(n) <= (q->size())",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                    0x295,"DFA::State *re2::DFA::WorkqToCachedState(Workq *, uint)");
    }
    bVar3 = Workq::is_mark(q,iVar4);
    if (bVar3) {
      if ((0 < iStack_34) && (inst_00[iStack_34 + -1] != -1)) {
        bVar2 = true;
        inst_00[iStack_34] = -1;
        iStack_34 = iStack_34 + 1;
      }
    }
    else {
      this_00 = Prog::inst(this->prog_,iVar4);
      IVar5 = Prog::Inst::opcode(this_00);
      if (((((IVar5 == kInstAltMatch) && (this->kind_ != kManyMatch)) &&
           ((this->kind_ != kFirstMatch ||
            ((piVar8 = SparseSet::begin(&q->super_SparseSet), piStack_48 == piVar8 &&
             (bVar3 = Prog::Inst::greedy(this_00,this->prog_), bVar3)))))) &&
          ((this->kind_ != kLongestMatch || (!bVar2)))) && ((flag & 0x1000) != 0)) {
        if (inst_00 != (int *)0x0) {
          operator_delete__(inst_00);
        }
        return (State *)0x2;
      }
      this_01 = Prog::inst(this->prog_,iVar4 + -1);
      iVar4 = Prog::Inst::last(this_01);
      if (iVar4 != 0) {
        inst_00[iStack_34] = *piStack_48;
        iStack_34 = iStack_34 + 1;
      }
      IVar5 = Prog::Inst::opcode(this_00);
      if (IVar5 == kInstEmptyWidth) {
        EVar6 = Prog::Inst::empty(this_00);
        local_38 = EVar6 | local_38;
      }
      IVar5 = Prog::Inst::opcode(this_00);
      if ((IVar5 == kInstMatch) && (bVar3 = Prog::anchor_end(this->prog_), !bVar3)) {
        bVar10 = true;
      }
    }
    piStack_48 = piStack_48 + 1;
  } while( true );
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, uint flag) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint needflags = 0;     // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;  // whether queue contains guaranteed kInstMatch
  bool sawmark = false;  // whether queue contains a Mark
  if (DebugDFA)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (DebugDFA)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        // Fall through.
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (DebugDFA)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}